

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace.c
# Opt level: O0

parasail_result_t *
parasail_sw_trace(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  long lVar9;
  byte bVar10;
  byte local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int *local_b8;
  int local_b0;
  int NWH;
  int F_ext;
  int F_opn;
  int E_ext;
  int E_opn;
  int H_dag;
  int E;
  int WH;
  int NH;
  int *matrow;
  int end_ref;
  int end_query;
  int score;
  int s1Len;
  int j;
  int i;
  int8_t *HT;
  int *F;
  int *H;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  s2 = (int *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_b0 = _s1Len;
    if (matrix->type != 0) {
      local_b0 = matrix->length;
    }
    end_ref = -0x40000000;
    matrow._4_4_ = local_b0;
    _s1_local = (char *)parasail_result_new_trace(local_b0,s2Len,0x10,1);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1480104;
      ptr = parasail_memalign_int(0x10,(long)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      piVar2 = ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row;
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2 = parasail_memalign_int(0x10,(long)local_b0);
          if (s2 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (s1Len = 0; s1Len < local_b0; s1Len = s1Len + 1) {
            s2[s1Len] = matrix->mapper[(byte)_s1[s1Len]];
          }
        }
        for (score = 0; score < s2Len; score = score + 1) {
          ptr[score] = matrix->mapper[(byte)_s2[score]];
        }
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        for (score = 1; score <= s2Len; score = score + 1) {
          ptr_00[score] = 0;
          ptr_01[score] = -0x40000000;
        }
        matrow._0_4_ = s2Len;
        for (s1Len = 1; s1Len <= local_b0; s1Len = s1Len + 1) {
          if (matrix->type == 0) {
            local_b8 = matrix->matrix + matrix->size * s2[s1Len + -1];
          }
          else {
            local_b8 = matrix->matrix + matrix->size * (s1Len + -1);
          }
          E = *ptr_00;
          H_dag = 0;
          E_opn = -0x40000000;
          *ptr_00 = 0;
          for (score = 1; score <= s2Len; score = score + 1) {
            iVar1 = ptr_00[score];
            iVar4 = iVar1 - open;
            iVar5 = ptr_01[score] - gap;
            local_bc = iVar5;
            if (iVar5 < iVar4) {
              local_bc = iVar4;
            }
            ptr_01[score] = local_bc;
            iVar6 = H_dag - open;
            iVar7 = E_opn - gap;
            local_c0 = iVar7;
            if (iVar7 < iVar6) {
              local_c0 = iVar6;
            }
            E_opn = local_c0;
            iVar8 = E + local_b8[ptr[score + -1]];
            local_c4 = iVar8;
            if (iVar8 < 1) {
              local_c4 = 0;
            }
            if (local_c0 < local_c4) {
              local_c8 = local_c4;
            }
            else {
              local_c8 = local_c0;
            }
            if (ptr_01[score] < local_c8) {
              local_cc = local_c8;
            }
            else {
              local_cc = ptr_01[score];
            }
            H_dag = local_cc;
            ptr_00[score] = local_cc;
            if (end_ref < local_cc) {
              matrow._4_4_ = s1Len + -1;
              matrow._0_4_ = score + -1;
            }
            else if ((end_ref == local_cc) && (score + -1 < (int)matrow)) {
              matrow._4_4_ = s1Len + -1;
              matrow._0_4_ = score + -1;
            }
            if (local_cc < end_ref) {
              local_d0 = end_ref;
            }
            else {
              local_d0 = local_cc;
            }
            end_ref = local_d0;
            uVar3 = 0x40;
            if (iVar5 < iVar4) {
              uVar3 = 0x20;
            }
            *(undefined1 *)((long)piVar2 + (long)(s1Len + -1) * (long)s2Len + (long)(score + -1)) =
                 uVar3;
            bVar10 = 0x10;
            if (iVar7 < iVar6) {
              bVar10 = 8;
            }
            lVar9 = (long)(s1Len + -1) * (long)s2Len + (long)(score + -1);
            *(byte *)((long)piVar2 + lVar9) = *(byte *)((long)piVar2 + lVar9) | bVar10;
            if (local_cc == iVar8) {
              local_d4 = 4;
            }
            else {
              local_d4 = 1;
              if (local_cc == ptr_01[score]) {
                local_d4 = 2;
              }
            }
            lVar9 = (long)(s1Len + -1) * (long)s2Len + (long)(score + -1);
            *(byte *)((long)piVar2 + lVar9) = *(byte *)((long)piVar2 + lVar9) | local_d4;
            if (local_cc == 0) {
              lVar9 = (long)(s1Len + -1) * (long)s2Len + (long)(score + -1);
              *(byte *)((long)piVar2 + lVar9) = *(byte *)((long)piVar2 + lVar9) & 0x78;
            }
            E = iVar1;
          }
        }
        ((parasail_result_t *)_s1_local)->score = end_ref;
        ((parasail_result_t *)_s1_local)->end_query = matrow._4_4_;
        ((parasail_result_t *)_s1_local)->end_ref = (int)matrow;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int8_t * restrict HT = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = 0;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (WH > score) {
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                end_query = i-1;
                end_ref = j-1;
            }
            score = MAX(score,WH);
            HT[1LL*(i-1)*s2Len + (j-1)] = (F_opn > F_ext) ? PARASAIL_DIAG_F
                                                          : PARASAIL_DEL_F;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                           : PARASAIL_INS_E;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (WH == H_dag) ? PARASAIL_DIAG
                                        : (WH == F[j])   ? PARASAIL_DEL
                                                         : PARASAIL_INS;
            if (0 == WH) {
                HT[1LL*(i-1)*s2Len + (j-1)] &= PARASAIL_ZERO_MASK;
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}